

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast.h
# Opt level: O3

void __thiscall
ikfast::IkSolution<double>::GetSolutionIndices
          (IkSolution<double> *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *v)

{
  int *piVar1;
  byte bVar2;
  iterator iVar3;
  long lVar4;
  bool bVar5;
  pointer pIVar6;
  long lVar7;
  IkSolution<double> *pIVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  uint local_58 [2];
  IkSolution<double> *local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  local_50 = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(v,0);
  local_58[1] = 0;
  iVar3._M_current = *(uint **)(v + 8);
  if (iVar3._M_current == *(uint **)(v + 0x10)) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (v,iVar3,local_58 + 1);
  }
  else {
    *iVar3._M_current = 0;
    *(uint **)(v + 8) = iVar3._M_current + 1;
  }
  pIVar6 = (local_50->_vbasesol).
           super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = (int)((long)(local_50->_vbasesol).
                      super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar6 >> 3) * -0x55555555;
  if (0 < (int)uVar9) {
    pIVar8 = local_50;
    local_40 = (ulong)(uVar9 & 0x7fffffff);
    do {
      uVar10 = local_40 - 1;
      bVar2 = pIVar6[uVar10].maxsolutions;
      local_38 = uVar10;
      if ((1 < bVar2) && (bVar2 != 0xff)) {
        lVar4 = *(long *)v;
        local_48 = *(long *)(v + 8);
        lVar11 = local_48 - lVar4 >> 2;
        if (local_48 != lVar4) {
          lVar7 = 0;
          do {
            *(uint *)(lVar4 + lVar7 * 4) = *(int *)(lVar4 + lVar7 * 4) * (uint)bVar2;
            lVar7 = lVar7 + 1;
          } while (lVar11 + (ulong)(lVar11 == 0) != lVar7);
        }
        if (local_48 != lVar4 && pIVar6[uVar10].indices[1] != 0xff) {
          lVar7 = 0;
          do {
            local_58[0] = (uint)(pIVar8->_vbasesol).
                                super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar10].indices[1] +
                          *(int *)(*(long *)v + lVar7 * 4);
            iVar3._M_current = *(uint **)(v + 8);
            if (iVar3._M_current == *(uint **)(v + 0x10)) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(v,iVar3,local_58);
              pIVar8 = local_50;
            }
            else {
              *iVar3._M_current = local_58[0];
              *(uint **)(v + 8) = iVar3._M_current + 1;
            }
            lVar7 = lVar7 + 1;
          } while (lVar11 + (ulong)(lVar11 == 0) != lVar7);
          pIVar6 = (pIVar8->_vbasesol).
                   super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        }
        if (pIVar6[uVar10].indices[0] != 0xff && local_48 != lVar4) {
          lVar4 = *(long *)v;
          lVar7 = 0;
          do {
            piVar1 = (int *)(lVar4 + lVar7 * 4);
            *piVar1 = *piVar1 + (uint)pIVar6[uVar10].indices[0];
            lVar7 = lVar7 + 1;
          } while (lVar11 + (ulong)(lVar11 == 0) != lVar7);
        }
      }
      bVar5 = 1 < (long)local_40;
      local_40 = local_38;
    } while (bVar5);
  }
  return;
}

Assistant:

virtual void GetSolutionIndices(std::vector<unsigned int>& v) const {
        v.resize(0);
        v.push_back(0);
        for(int i = (int)_vbasesol.size()-1; i >= 0; --i) {
            if( _vbasesol[i].maxsolutions != (unsigned char)-1 && _vbasesol[i].maxsolutions > 1 ) {
                for(size_t j = 0; j < v.size(); ++j) {
                    v[j] *= _vbasesol[i].maxsolutions;
                }
                size_t orgsize=v.size();
                if( _vbasesol[i].indices[1] != (unsigned char)-1 ) {
                    for(size_t j = 0; j < orgsize; ++j) {
                        v.push_back(v[j]+_vbasesol[i].indices[1]);
                    }
                }
                if( _vbasesol[i].indices[0] != (unsigned char)-1 ) {
                    for(size_t j = 0; j < orgsize; ++j) {
                        v[j] += _vbasesol[i].indices[0];
                    }
                }
            }
        }
    }